

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_object.c
# Opt level: O3

char * tnt_sbuf_object_resize(tnt_stream *s,size_t size)

{
  undefined8 *puVar1;
  void *ptr;
  long lVar2;
  ulong size_00;
  ulong uVar3;
  
  puVar1 = (undefined8 *)s->data;
  ptr = (void *)*puVar1;
  lVar2 = puVar1[1];
  uVar3 = size + lVar2;
  if ((ulong)puVar1[2] < uVar3) {
    size_00 = puVar1[2] * 2;
    if (size_00 <= uVar3) {
      size_00 = uVar3;
    }
    ptr = tnt_mem_realloc(ptr,size_00);
    if (ptr == (void *)0x0) {
      tnt_mem_free((void *)*puVar1);
      return (char *)0x0;
    }
    *puVar1 = ptr;
    puVar1[2] = size_00;
    lVar2 = puVar1[1];
  }
  return (char *)(lVar2 + (long)ptr);
}

Assistant:

static char *
tnt_sbuf_object_resize(struct tnt_stream *s, size_t size) {
	struct tnt_stream_buf *sb = TNT_SBUF_CAST(s);
	if (sb->size + size > sb->alloc) {
		size_t newsize = 2 * (sb->alloc);
		if (newsize < sb->size + size)
			newsize = sb->size + size;
		char *nd = tnt_mem_realloc(sb->data, newsize);
		if (nd == NULL) {
			tnt_mem_free(sb->data);
			return NULL;
		}
		sb->data = nd;
		sb->alloc = newsize;
	}
	return sb->data + sb->size;
}